

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDVertex::HasBoundaryVertexTopology(ON_SubDVertex *this)

{
  ulong uVar1;
  ON_SubDEdge *e;
  unsigned_short vei;
  uint boundary_count;
  ON_SubDVertex *this_local;
  
  if ((((1 < this->m_edge_count) && ((uint)this->m_edge_count == this->m_face_count + 1)) &&
      (this->m_edges != (ON_SubDEdgePtr *)0x0)) && (this->m_faces != (ON_SubDFace **)0x0)) {
    e._4_4_ = 0;
    for (e._2_2_ = 0; e._2_2_ < this->m_edge_count; e._2_2_ = e._2_2_ + 1) {
      uVar1 = this->m_edges[e._2_2_].m_ptr & 0xfffffffffffffff8;
      if (((uVar1 == 0) || (*(short *)(uVar1 + 100) == 0)) || (2 < *(ushort *)(uVar1 + 100))) {
        return false;
      }
      if (*(short *)(uVar1 + 100) == 1) {
        e._4_4_ = e._4_4_ + 1;
      }
    }
    if (e._4_4_ == 2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_SubDVertex::HasBoundaryVertexTopology() const
{
  if (m_edge_count >= 2 && m_edge_count == m_face_count+1 && nullptr != m_edges && nullptr != m_faces)
  {
    unsigned boundary_count = 0;
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 0 == e->m_face_count || e->m_face_count > 2)
        return false;
      if (1 == e->m_face_count)
        ++boundary_count;
    }
    if (2 == boundary_count)
      return true;
  }    
  return false;
}